

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

Collator * __thiscall
icu_63::RuleBasedCollator::setMaxVariable
          (RuleBasedCollator *this,UColReorderCode group,UErrorCode *errorCode)

{
  byte *pbVar1;
  CollationSettings *pCVar2;
  uint32_t uVar3;
  int32_t iVar4;
  uint uVar5;
  CollationSettings *this_00;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (group == UCOL_REORDER_CODE_DEFAULT) {
      uVar5 = 0xffffffff;
    }
    else {
      if ((group & 0xfffffffc) != UCOL_REORDER_CODE_FIRST) {
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return &this->super_Collator;
      }
      uVar5 = group + 0xfffff000;
    }
    if (uVar5 == ((uint)this->settings->options >> 4 & 7)) {
      pbVar1 = (byte *)((long)&this->explicitlySetAttributes + 1);
      *pbVar1 = *pbVar1 | 1;
    }
    else {
      pCVar2 = this->tailoring->settings;
      if (uVar5 == 0xffffffff && this->settings == pCVar2) {
        pbVar1 = (byte *)((long)&this->explicitlySetAttributes + 1);
        *pbVar1 = *pbVar1 & 0xfe;
      }
      else {
        this_00 = SharedObject::copyOnWrite<icu_63::CollationSettings>(&this->settings);
        if (this_00 == (CollationSettings *)0x0) {
          *errorCode = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          if (group == UCOL_REORDER_CODE_DEFAULT) {
            group = (uint)pCVar2->options >> 4 & 7 | UCOL_REORDER_CODE_FIRST;
          }
          uVar3 = CollationData::getLastPrimaryForGroup(this->data,group);
          CollationSettings::setMaxVariable(this_00,uVar5,pCVar2->options,errorCode);
          if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            this_00->variableTop = uVar3;
            iVar4 = CollationFastLatin::getOptions
                              (this->data,this_00,this_00->fastLatinPrimaries,0x180);
            this_00->fastLatinOptions = iVar4;
            if (uVar5 == 0xffffffff) {
              uVar5 = this->explicitlySetAttributes & 0xfffffeff;
            }
            else {
              uVar5 = this->explicitlySetAttributes | 0x100;
            }
            this->explicitlySetAttributes = uVar5;
          }
        }
      }
    }
  }
  return &this->super_Collator;
}

Assistant:

Collator &
RuleBasedCollator::setMaxVariable(UColReorderCode group, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return *this; }
    // Convert the reorder code into a MaxVariable number, or UCOL_DEFAULT=-1.
    int32_t value;
    if(group == UCOL_REORDER_CODE_DEFAULT) {
        value = UCOL_DEFAULT;
    } else if(UCOL_REORDER_CODE_FIRST <= group && group <= UCOL_REORDER_CODE_CURRENCY) {
        value = group - UCOL_REORDER_CODE_FIRST;
    } else {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return *this;
    }
    CollationSettings::MaxVariable oldValue = settings->getMaxVariable();
    if(value == oldValue) {
        setAttributeExplicitly(ATTR_VARIABLE_TOP);
        return *this;
    }
    const CollationSettings &defaultSettings = getDefaultSettings();
    if(settings == &defaultSettings) {
        if(value == UCOL_DEFAULT) {
            setAttributeDefault(ATTR_VARIABLE_TOP);
            return *this;
        }
    }
    CollationSettings *ownedSettings = SharedObject::copyOnWrite(settings);
    if(ownedSettings == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return *this;
    }

    if(group == UCOL_REORDER_CODE_DEFAULT) {
        group = (UColReorderCode)(UCOL_REORDER_CODE_FIRST + defaultSettings.getMaxVariable());
    }
    uint32_t varTop = data->getLastPrimaryForGroup(group);
    U_ASSERT(varTop != 0);
    ownedSettings->setMaxVariable(value, defaultSettings.options, errorCode);
    if(U_FAILURE(errorCode)) { return *this; }
    ownedSettings->variableTop = varTop;
    setFastLatinOptions(*ownedSettings);
    if(value == UCOL_DEFAULT) {
        setAttributeDefault(ATTR_VARIABLE_TOP);
    } else {
        setAttributeExplicitly(ATTR_VARIABLE_TOP);
    }
    return *this;
}